

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

Container *
env_container_get(Container *__return_storage_ptr__,char *identifer,int line,Environment *env)

{
  Instance *pIVar1;
  anon_union_8_4_50a03f35_for_Literal_2 aVar2;
  undefined8 uVar3;
  char **ppcVar4;
  undefined8 uVar5;
  Statement *pSVar6;
  Record *pRVar7;
  char *__format;
  
  pRVar7 = env_match(identifer,env);
  if (pRVar7 == (Record *)0x0) {
    __format = "\x1b[31m\n[Runtime Error] [Line:%d] Container %s is not defined!\x1b[0m";
  }
  else {
    if ((pRVar7->object).type == OBJECT_CONTAINER) {
      pIVar1 = (pRVar7->object).field_1.instance;
      aVar2 = (pRVar7->object).field_1.literal.field_2;
      uVar3 = *(undefined8 *)((long)&(pRVar7->object).field_1 + 0x10);
      ppcVar4 = (pRVar7->object).field_1.routine.arguments;
      uVar5 = *(undefined8 *)((long)&(pRVar7->object).field_1 + 0x20);
      pSVar6 = *(Statement **)((long)&(pRVar7->object).field_1 + 0x28);
      (__return_storage_ptr__->constructor).numStatements = (int)uVar5;
      (__return_storage_ptr__->constructor).blockName = (int)((ulong)uVar5 >> 0x20);
      (__return_storage_ptr__->constructor).statements = pSVar6;
      *(undefined8 *)&__return_storage_ptr__->arity = uVar3;
      __return_storage_ptr__->arguments = ppcVar4;
      *(Instance **)__return_storage_ptr__ = pIVar1;
      __return_storage_ptr__->name = (char *)aVar2;
      return __return_storage_ptr__;
    }
    __format = "\x1b[31m\n[Runtime Error] [Line:%d] %s is not a container!\x1b[0m";
  }
  printf(__format,(ulong)(uint)line,identifer);
  stop();
}

Assistant:

Container env_container_get(char *identifer, int line, Environment *env){
    Record *match = env_match(identifer, env);
    if(match == NULL){
        printf(runtime_error("Container %s is not defined!"), line, identifer);
        stop();
    }
    else if(match->object.type != OBJECT_CONTAINER){
        printf(runtime_error("%s is not a container!"), line, identifer);
        stop();
    }
    return match->object.container;
}